

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O3

void __thiscall sf::priv::WindowImplX11::setMouseCursorGrabbed(WindowImplX11 *this,bool grabbed)

{
  int iVar1;
  Time TVar2;
  ostream *poVar3;
  int iVar4;
  
  if ((this->m_fullscreen == false) && (this->m_cursorGrabbed != grabbed)) {
    if (grabbed) {
      iVar4 = 5;
      do {
        iVar1 = XGrabPointer(this->m_display,this->m_window,1,0,1,1,this->m_window,0,0);
        if (iVar1 == 0) {
          this->m_cursorGrabbed = true;
          return;
        }
        TVar2 = milliseconds(0x32);
        sleep((uint)TVar2.m_microseconds);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      if ((this->m_cursorGrabbed & 1U) == 0) {
        poVar3 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"Failed to grab mouse cursor",0x1b);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        return;
      }
    }
    else {
      XUngrabPointer(this->m_display,0);
      this->m_cursorGrabbed = false;
    }
  }
  return;
}

Assistant:

void WindowImplX11::setMouseCursorGrabbed(bool grabbed)
{
    using namespace WindowsImplX11Impl;

    // This has no effect in fullscreen mode
    if (m_fullscreen || (m_cursorGrabbed == grabbed))
        return;

    if (grabbed)
    {
        // Try multiple times to grab the cursor
        for (unsigned int trial = 0; trial < maxTrialsCount; ++trial)
        {
            int result = XGrabPointer(m_display, m_window, True, None, GrabModeAsync, GrabModeAsync, m_window, None, CurrentTime);

            if (result == GrabSuccess)
            {
                m_cursorGrabbed = true;
                break;
            }

            // The cursor grab failed, trying again after a small sleep
            sf::sleep(sf::milliseconds(50));
        }

        if (!m_cursorGrabbed)
            err() << "Failed to grab mouse cursor" << std::endl;
    }
    else
    {
        // Release the cursor from the window and disable cursor grabbing
        XUngrabPointer(m_display, CurrentTime);
        m_cursorGrabbed = false;
    }
}